

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O1

void __thiscall agg::line_profile_aa::width(line_profile_aa *this,double w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  if (0.0 <= w) {
    dVar2 = w;
  }
  dVar1 = *(double *)(this + 0x120);
  dVar3 = dVar2;
  if (dVar1 <= dVar2) {
    dVar3 = dVar1;
  }
  dVar3 = (dVar3 + dVar2) * 0.5 - dVar1;
  dVar2 = 0.0;
  if (0.0 <= dVar3) {
    dVar2 = dVar3;
  }
  set(this,dVar2,
      (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar1 |
              (ulong)(dVar1 + dVar3) & -(ulong)(dVar3 < 0.0)));
  return;
}

Assistant:

void line_profile_aa::width(double w)
    {
        if(w < 0.0) w = 0.0;

        if(w < m_smoother_width) w += w;
        else                     w += m_smoother_width;

        w *= 0.5;

        w -= m_smoother_width;
        double s = m_smoother_width;
        if(w < 0.0) 
        {
            s += w;
            w = 0.0;
        }
        set(w, s);
    }